

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.cpp
# Opt level: O2

void lumeview::MessageQueue::remove_receiver(MessageReceiver *rec)

{
  __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
  __position;
  undefined1 local_10 [8];
  
  inst();
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<lumeview::MessageReceiver**,std::vector<lumeview::MessageReceiver*,std::allocator<lumeview::MessageReceiver*>>>,__gnu_cxx::__ops::_Iter_equals_val<lumeview::MessageReceiver*const>>
                         (inst::mq.m_receivers.
                          super__Vector_base<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          inst::mq.m_receivers.
                          super__Vector_base<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,local_10);
  if (__position._M_current !=
      inst::mq.m_receivers.
      super__Vector_base<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>::erase
              (&inst::mq.m_receivers,(const_iterator)__position._M_current);
  }
  return;
}

Assistant:

void MessageQueue::remove_receiver (MessageReceiver* rec)
{
	auto& receivers = inst().m_receivers;
	auto it = find (receivers.begin(), receivers.end(), rec);
	if (it != receivers.end())
		receivers.erase (it);
}